

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
 unodb::detail::olc_impl_helpers::
 add_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
           (olc_inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            *inode,byte key_byte,
           basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,value_view v,
           olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
           *db_instance,
           tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
           depth,read_critical_section *node_critical_section,
           in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
           *node_in_parent,read_critical_section *parent_critical_section,
           olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>_conflict
           *cached_leaf)

{
  atomic<long> *paVar1;
  long lVar2;
  uint8_t children_count_;
  optimistic_lock *this;
  ulong uVar3;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var4;
  undefined8 unaff_RBX;
  ulong uVar5;
  undefined7 in_register_00000031;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar6;
  write_guard local_38;
  write_guard write_unlock_on_exit;
  
  uVar3 = CONCAT71(in_register_00000031,key_byte) & 0xffffffff;
  uVar5 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((inode->super_olc_inode_256_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>).
      children._M_elems[uVar3].value._M_i.tagged_ptr == 0) {
    create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              (cached_leaf,k,v,db_instance);
    children_count_ =
         (inode->super_olc_inode_256_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
         ).
         super_basic_inode_256_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
         .
         super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
         .children_count.value.super___atomic_base<unsigned_char>._M_i;
    local_38.lock = optimistic_lock::write_guard::try_lock_upgrade(node_critical_section);
    if (local_38.lock != (optimistic_lock *)0x0) {
      this = parent_critical_section->lock;
      if ((this->read_lock_count).super___atomic_base<long>._M_i < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      if ((parent_critical_section->version).version ==
          (this->version).version.super___atomic_base<unsigned_long>._M_i) {
        LOCK();
        paVar1 = &this->read_lock_count;
        lVar2 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        parent_critical_section->lock = (optimistic_lock *)0x0;
        basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
        ::add_to_nonfull(&inode->
                          super_olc_inode_256_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                         ,cached_leaf,(tree_depth_type)depth.value,children_count_);
        optimistic_lock::write_guard::~write_guard(&local_38);
        _Var4._M_value =
             (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
             0x0;
        goto LAB_001867aa;
      }
      optimistic_lock::dec_read_lock_count(this);
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
    optimistic_lock::write_guard::~write_guard(&local_38);
    _Var4._M_value =
         (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0;
    uVar5 = 0;
  }
  else {
    _Var4._M_value =
         (inode->super_olc_inode_256_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
         ).children._M_elems + uVar3;
  }
LAB_001867aa:
  oVar6.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._8_8_ = uVar5 & 0xffffffff;
  oVar6.
  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
  ._M_payload.
  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ._M_payload._M_value = _Var4._M_value;
  return (optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
          )oVar6.
           super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  ;
}

Assistant:

[[nodiscard]] std::optional<in_critical_section<olc_node_ptr>*>
olc_impl_helpers::add_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k, value_view v,
    olc_db<Key, Value>& db_instance, tree_depth<basic_art_key<Key>> depth,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    optimistic_lock::read_critical_section& parent_critical_section,
    olc_db_leaf_unique_ptr<Key, Value>& cached_leaf) {
  auto* const child_in_parent = inode.find_child(key_byte).second;

  if (child_in_parent == nullptr) {
    create_leaf_if_needed(cached_leaf, k, v, db_instance);

    const auto children_count = inode.get_children_count();

    if constexpr (!std::is_same_v<INode, olc_inode_256<Key, Value>>) {
      if (UNODB_DETAIL_UNLIKELY(children_count == INode::capacity)) {
        auto larger_node{
            INode::larger_derived_type::create(db_instance, inode)};
        {
          const optimistic_lock::write_guard write_unlock_on_exit{
              std::move(parent_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart()))
            return {};  // LCOV_EXCL_LINE

          optimistic_lock::write_guard node_write_guard{
              std::move(node_critical_section)};
          if (UNODB_DETAIL_UNLIKELY(node_write_guard.must_restart())) return {};

          larger_node->init(db_instance, inode, node_write_guard,
                            std::move(cached_leaf), depth);
          *node_in_parent = detail::olc_node_ptr{
              larger_node.release(), INode::larger_derived_type::type};

          UNODB_DETAIL_ASSERT(!node_write_guard.active());
        }

#ifdef UNODB_DETAIL_WITH_STATS
        db_instance
            .template account_growing_inode<INode::larger_derived_type::type>();
#endif  // UNODB_DETAIL_WITH_STATS

        return child_in_parent;
      }
    }

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) return {};

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    inode.add_to_nonfull(std::move(cached_leaf), depth, children_count);
  }

  return child_in_parent;
}